

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O0

Id dxil_spv::build_index_divider(Impl *impl,Value *offset,uint addr_shift_log2,uint vecsize)

{
  bool bVar1;
  Id IVar2;
  Op op;
  Builder *this;
  Operation *pOVar3;
  Operation *bias_op;
  Id bias_id;
  Operation *scale_op;
  Id scaled_id;
  Op bias_opcode;
  RawBufferAccessSplit split;
  Id index_id;
  Builder *builder;
  uint vecsize_local;
  uint addr_shift_log2_local;
  Value *offset_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  memset(&scaled_id,0,0x18);
  bVar1 = extract_raw_buffer_access_split
                    (offset,1,addr_shift_log2,vecsize,(RawBufferAccessSplit *)&scaled_id);
  if (bVar1) {
    if (split.bias == 0) {
      IVar2 = spv::Builder::makeUintConstant(this,(uint)split.scale,false);
      return IVar2;
    }
    op = OpISub;
    if (0 < (long)split.scale) {
      op = OpIAdd;
    }
    if (op == OpISub) {
      split.scale = -split.scale;
    }
    if (_scaled_id == 1) {
      scale_op._0_4_ = Converter::Impl::get_id_for_value(impl,(Value *)split.bias,0);
    }
    else {
      IVar2 = spv::Builder::makeUintType(this,0x20);
      pOVar3 = Converter::Impl::allocate(impl,OpIMul,IVar2);
      IVar2 = Converter::Impl::get_id_for_value(impl,(Value *)split.bias,0);
      Operation::add_id(pOVar3,IVar2);
      IVar2 = spv::Builder::makeUintConstant(this,scaled_id,false);
      Operation::add_id(pOVar3,IVar2);
      Converter::Impl::add(impl,pOVar3,false);
      scale_op._0_4_ = pOVar3->id;
    }
    if (split.scale == 0) {
      bias_op._4_4_ = (Id)scale_op;
    }
    else {
      IVar2 = spv::Builder::makeUintType(this,0x20);
      pOVar3 = Converter::Impl::allocate(impl,op,IVar2);
      Operation::add_id(pOVar3,(Id)scale_op);
      IVar2 = spv::Builder::makeUintConstant(this,(uint)split.scale,false);
      Operation::add_id(pOVar3,IVar2);
      Converter::Impl::add(impl,pOVar3,false);
      bias_op._4_4_ = pOVar3->id;
    }
    split.dynamic_index._4_4_ = bias_op._4_4_;
  }
  else {
    if (vecsize != 1) {
      __assert_fail("vecsize == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/dxil/dxil_common.cpp"
                    ,0x171,
                    "spv::Id dxil_spv::build_index_divider(Converter::Impl &, const LLVMBC::Value *, unsigned int, unsigned int)"
                   );
    }
    split.dynamic_index._4_4_ = build_index_divider_fallback(impl,offset,addr_shift_log2);
  }
  return split.dynamic_index._4_4_;
}

Assistant:

spv::Id build_index_divider(Converter::Impl &impl, const llvm::Value *offset,
                            unsigned addr_shift_log2, unsigned vecsize)
{
	auto &builder = impl.builder();
	// Attempt to do trivial constant folding to make output a little more sensible to read.
	// Try to find an expression for offset which is "constant0 * offset + constant1",
	// where constant0 and constant1 are aligned with addr_shift_log2.

	spv::Id index_id;
	RawBufferAccessSplit split = {};

	if (extract_raw_buffer_access_split(offset, 1, addr_shift_log2, vecsize, split))
	{
		if (!split.dynamic_index)
			return builder.makeUintConstant(split.bias);

		spv::Op bias_opcode = split.bias > 0 ? spv::OpIAdd : spv::OpISub;
		if (bias_opcode == spv::OpISub)
			split.bias = -split.bias;

		spv::Id scaled_id;
		if (split.scale != 1)
		{
			Operation *scale_op = impl.allocate(spv::OpIMul, builder.makeUintType(32));
			scale_op->add_id(impl.get_id_for_value(split.dynamic_index));
			scale_op->add_id(builder.makeUintConstant(split.scale));
			impl.add(scale_op);
			scaled_id = scale_op->id;
		}
		else
			scaled_id = impl.get_id_for_value(split.dynamic_index);

		spv::Id bias_id;
		if (split.bias != 0)
		{
			Operation *bias_op = impl.allocate(bias_opcode, builder.makeUintType(32));
			bias_op->add_id(scaled_id);
			bias_op->add_id(builder.makeUintConstant(split.bias));
			impl.add(bias_op);
			bias_id = bias_op->id;
		}
		else
			bias_id = scaled_id;

		index_id = bias_id;
	}
	else
	{
		assert(vecsize == 1);
		index_id = build_index_divider_fallback(impl, offset, addr_shift_log2);
	}

	return index_id;
}